

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<false,true,true>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined8 uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if ((long)*(int *)(this + 0x14) < 1) {
    auVar5 = ZEXT816(0);
  }
  else {
    auVar5 = ZEXT816(0);
    lVar4 = 0;
    do {
      auVar6._0_4_ = *(float *)(*(long *)(this + 0xf8) + lVar4 * 4) /
                     *(float *)(*(long *)(this + 0xf0) + lVar4 * 4);
      auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar5 = vcvtps2pd_avx(auVar5);
      auVar6 = vinsertps_avx(ZEXT416((uint)(auVar6._0_4_ * auVar6._0_4_)),auVar6,0x10);
      auVar6 = vcvtps2pd_avx(auVar6);
      uVar1 = *(undefined8 *)(*(long *)(this + 0x78) + lVar4 * 8);
      auVar3._8_8_ = uVar1;
      auVar3._0_8_ = uVar1;
      auVar5 = vfmadd132pd_avx512vl(auVar6,auVar5,auVar3);
      auVar5 = vcvtpd2ps_avx(auVar5);
      lVar4 = lVar4 + 1;
    } while (*(int *)(this + 0x14) != lVar4);
    auVar5 = vcvtps2pd_avx(auVar5);
  }
  dVar2 = (double)vmovhps_avx(auVar5);
  *outSumDerivatives = dVar2;
  dVar2 = (double)vmovlps_avx(auVar5);
  *outSumSquaredDerivatives = dVar2;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}